

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O1

char * nh_build_plselection_prompt
                 (char *buf,int buflen,int rolenum,int racenum,int gendnum,int alignnum)

{
  size_t sVar1;
  char *pcVar2;
  int num_post_attribs;
  char tmpbuf [256];
  char local_138 [4];
  undefined2 auStack_134 [2];
  undefined6 uStack_130;
  
  if (buflen < 0x80) {
    buf = "Shall I pick a character for you?";
  }
  else {
    uStack_130 = 0x206b636970;
    _local_138 = 0x206c6c616853;
    auStack_134[1] = 0x2049;
    sVar1 = strlen(local_138);
    pcVar2 = local_138 + sVar1;
    if ((uint)rolenum < 0xe || racenum != -1) {
      *(undefined2 *)((long)auStack_134 + sVar1) = 0x20;
      builtin_strncpy(local_138 + sVar1,"your",4);
    }
    else {
      local_138[sVar1 + 2] = '\0';
      pcVar2[0] = 'a';
      pcVar2[1] = ' ';
    }
    pcVar2 = eos(local_138);
    sVar1 = strlen(local_138);
    nh_root_plselection_prompt(pcVar2,buflen - (int)sVar1,rolenum,racenum,gendnum,alignnum);
    pcVar2 = s_suffix(local_138);
    strcpy(buf,pcVar2);
    num_post_attribs = (int)post_attribs;
    if (num_post_attribs != 0) {
      if (pa[2] != '\0') {
        pcVar2 = eos(buf);
        promptsep(pcVar2,num_post_attribs);
        sVar1 = strlen(buf);
        builtin_strncpy(buf + sVar1,"race",5);
      }
      if (pa[3] != '\0') {
        pcVar2 = eos(buf);
        promptsep(pcVar2,num_post_attribs);
        sVar1 = strlen(buf);
        builtin_strncpy(buf + sVar1,"role",5);
      }
      if (pa[1] != '\0') {
        pcVar2 = eos(buf);
        promptsep(pcVar2,num_post_attribs);
        sVar1 = strlen(buf);
        builtin_strncpy(buf + sVar1,"gender",7);
      }
      if (pa[0] != '\0') {
        pcVar2 = eos(buf);
        promptsep(pcVar2,num_post_attribs);
        sVar1 = strlen(buf);
        builtin_strncpy(buf + sVar1,"alignment",10);
      }
    }
    sVar1 = strlen(buf);
    builtin_strncpy(buf + sVar1," for you?",10);
  }
  return buf;
}

Assistant:

char *nh_build_plselection_prompt(char *buf, int buflen, int rolenum, int racenum,
			       int gendnum, int alignnum)
{
	const char *defprompt = "Shall I pick a character for you?";
	int num_post_attribs = 0;
	char tmpbuf[BUFSZ];
	
	if (buflen < QBUFSZ)
		return (char *)defprompt;

	strcpy(tmpbuf, "Shall I pick ");
	if (racenum != ROLE_NONE || validrole(rolenum))
		strcat(tmpbuf, "your ");
	else {
		strcat(tmpbuf, "a ");
	}
	/* <your> */

	nh_root_plselection_prompt(eos(tmpbuf), buflen - strlen(tmpbuf),
					rolenum, racenum, gendnum, alignnum);
	sprintf(buf, "%s", s_suffix(tmpbuf));

	/* buf should now be:
	 * < your lawful female gnomish cavewoman's> || <your lawful female gnome's>
	 *    || <your lawful female character's>
	 *
         * Now append the post attributes to it
	 */

	num_post_attribs = post_attribs;
	if (post_attribs) {
		if (pa[BP_RACE]) {
			promptsep(eos(buf), num_post_attribs);
			strcat(buf, "race");
		}
		if (pa[BP_ROLE]) {
			promptsep(eos(buf), num_post_attribs);
			strcat(buf, "role");
		}
		if (pa[BP_GEND]) {
			promptsep(eos(buf), num_post_attribs);
			strcat(buf, "gender");
		}
		if (pa[BP_ALIGN]) {
			promptsep(eos(buf), num_post_attribs);
			strcat(buf, "alignment");
		}
	}
	strcat(buf, " for you?");
	return buf;
}